

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastTable(Gia_Man_t *pNew,word *pTable,int *pFans,int nFans,int nOuts,Vec_Int_t *vRes)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  word *pTruth;
  word wVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  Vec_Int_t vLeaves;
  
  p = Vec_IntAlloc(0);
  iVar2 = 1 << ((byte)nFans - 6 & 0x1f);
  if (nFans < 7) {
    iVar2 = 1;
  }
  vLeaves.nCap = nFans;
  vLeaves.nSize = nFans;
  vLeaves.pArray = pFans;
  pTruth = (word *)malloc((long)iVar2 << 3);
  bVar1 = (byte)nFans & 0x1f;
  uVar6 = 1 << bVar1;
  vRes->nSize = 0;
  iVar9 = 0;
  if (0 < nFans) {
    iVar9 = nFans;
  }
  iVar3 = 0;
  if (1 << bVar1 < 1) {
    uVar6 = 0;
  }
  if (nOuts < 1) {
    nOuts = 0;
  }
  for (; iVar3 != nOuts; iVar3 = iVar3 + 1) {
    uVar7 = 0;
    memset(pTruth,0,(long)iVar2 << 3);
    for (uVar5 = 0; uVar5 != uVar6; uVar5 = uVar5 + 1) {
      iVar10 = (int)uVar7;
      iVar8 = iVar9;
      while (bVar11 = iVar8 != 0, iVar8 = iVar8 + -1, bVar11) {
        if ((pTable[(int)uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0) {
          pTruth[uVar5 >> 6] = pTruth[uVar5 >> 6] | 1L << ((byte)uVar5 & 0x3f);
        }
        uVar7 = (ulong)((int)uVar7 + 1);
      }
      uVar7 = (ulong)(uint)(iVar10 + nFans);
    }
    if (nFans < 6) {
      wVar4 = Abc_Tt6Stretch(*pTruth,nFans);
      *pTruth = wVar4;
    }
    iVar8 = Kit_TruthToGia(pNew,(uint *)pTruth,nFans,p,&vLeaves,1);
    Vec_IntPush(vRes,iVar8);
  }
  Vec_IntFree(p);
  free(pTruth);
  return;
}

Assistant:

void Wlc_BlastTable( Gia_Man_t * pNew, word * pTable, int * pFans, int nFans, int nOuts, Vec_Int_t * vRes )
{
    extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
    Vec_Int_t * vMemory = Vec_IntAlloc( 0 );
    Vec_Int_t vLeaves = { nFans, nFans, pFans };
    word * pTruth = ABC_ALLOC( word, Abc_TtWordNum(nFans) );
    int o, i, m, iLit, nMints = (1 << nFans);
    Vec_IntClear( vRes );
    for ( o = 0; o < nOuts; o++ )
    {
        // derive truth table
        memset( pTruth, 0, sizeof(word) * Abc_TtWordNum(nFans) );
        for ( m = 0; m < nMints; m++ )
            for ( i = 0; i < nFans; i++ )
                if ( Abc_TtGetBit( pTable, m * nFans + i ) )
                    Abc_TtSetBit( pTruth, m );
        // implement truth table
        if ( nFans < 6 )
            pTruth[0] = Abc_Tt6Stretch( pTruth[0], nFans );
        iLit = Kit_TruthToGia( pNew, (unsigned *)pTruth, nFans, vMemory, &vLeaves, 1 );
        Vec_IntPush( vRes, iLit );
    }
    Vec_IntFree( vMemory );
    ABC_FREE( pTruth );
}